

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

void __thiscall
ON_OBSOLETE_V5_DimOrdinate::CalcKinkPoints
          (ON_OBSOLETE_V5_DimOrdinate *this,ON_2dPoint p0,ON_2dPoint p1,int direction,
          double default_offset,ON_2dPoint *k0,ON_2dPoint *k1)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  ON_2dPoint p1_local;
  ON_2dPoint p0_local;
  
  p1_local.y = p1.y;
  p1_local.x = p1.x;
  p0_local.y = p0.y;
  p0_local.x = p0.x;
  uVar3 = -(ulong)(this->m_kink_offset_0 == -1.23432101234321e+308);
  uVar3 = ~uVar3 & (ulong)this->m_kink_offset_0 | uVar3 & (ulong)default_offset;
  uVar4 = -(ulong)(this->m_kink_offset_1 == -1.23432101234321e+308);
  dVar6 = (double)(~uVar4 & (ulong)this->m_kink_offset_1 | (ulong)default_offset & uVar4);
  pdVar2 = ON_2dPoint::operator[](&p0_local,1 - direction);
  dVar1 = *pdVar2;
  pdVar2 = ON_2dPoint::operator[](&p1_local,1 - direction);
  uVar4 = -(ulong)(*pdVar2 < dVar1);
  dVar5 = (double)(~uVar4 & uVar3 | (uVar3 ^ 0x8000000000000000) & uVar4);
  if (*pdVar2 < dVar1) {
    dVar6 = -dVar6;
  }
  if (direction == 0) {
    p1_local.y = p1_local.y - dVar5;
    p0_local.y = p1_local.y - dVar6;
  }
  else {
    p1_local.x = p1_local.x - dVar5;
    p0_local.x = p1_local.x - dVar6;
  }
  k1->x = p0_local.x;
  k1->y = p0_local.y;
  k0->x = p1_local.x;
  k0->y = p1_local.y;
  return;
}

Assistant:

void ON_OBSOLETE_V5_DimOrdinate::CalcKinkPoints( ON_2dPoint p0, ON_2dPoint p1, 
                                            int direction, double default_offset,
                                            ON_2dPoint& k0, ON_2dPoint& k1) const
{
  double offset0 = KinkOffset( 0);
  double offset1 = KinkOffset( 1);

  // if these haven't been set by dragging the offset points
  // use 2*textheight
  if( offset0 == ON_UNSET_VALUE)
    offset0 = default_offset;
  if( offset1 == ON_UNSET_VALUE)
    offset1 = default_offset;

  if( p0[1-direction] > p1[1-direction])
  {
    offset0 = -offset0;
    offset1 = -offset1;
  }

  //double d = fabs( p0[1-direction] - p1[1-direction]);

  if( direction == 0)
  {
    //if( d - fabs( offset0) > default_offset)
    //{
      k1.x = p0.x;
      k1.y = p1.y - offset0 - offset1;
    //}
    //else
    //{
    //  k1.x = p0.x;
    //  k1.y = p1.y + offset0 - offset1;
    //}

    k0.x = p1.x;
    k0.y = p1.y - offset0;
  }
  else
  {
    //if( d - fabs( offset0) > default_offset)
    //{
      k1.x = p1.x - offset0 - offset1;
      k1.y = p0.y;
    //}
    //else
    //{
    //  k1.x = p1.x + offset0 - offset1;
    //  k1.y = p0.y;
    //}

    k0.x = p1.x - offset0;
    k0.y = p1.y;
  }
}